

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_auth.cc
# Opt level: O2

bool __thiscall
prometheus::BasicAuthHandler::AuthorizeInner
          (BasicAuthHandler *this,CivetServer *param_1,mg_connection *conn)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> username;
  string decoded;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> b64Auth;
  string authHeaderStr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> password;
  
  pcVar3 = mg_get_header(conn,"Authorization");
  if (pcVar3 == (char *)0x0) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&authHeaderStr,pcVar3,(allocator *)&prefix);
    std::__cxx11::string::string((string *)&prefix,"Basic ",(allocator *)&b64Auth);
    iVar2 = std::__cxx11::string::compare((ulong)&authHeaderStr,0,(string *)prefix._M_string_length)
    ;
    if (iVar2 == 0) {
      std::__cxx11::string::substr((ulong)&b64Auth,(ulong)&authHeaderStr);
      decoded._M_dataplus._M_p = (pointer)&decoded.field_2;
      decoded._M_string_length = 0;
      decoded.field_2._M_local_buf[0] = '\0';
      detail::base64_decode(&username,&b64Auth);
      std::__cxx11::string::operator=((string *)&decoded,(string *)&username);
      std::__cxx11::string::~string((string *)&username);
      bVar1 = false;
      lVar4 = std::__cxx11::string::find((char)&decoded,0x3a);
      if (lVar4 != -1) {
        std::__cxx11::string::substr((ulong)&username,(ulong)&decoded);
        std::__cxx11::string::substr((ulong)&password,(ulong)&decoded);
        bVar1 = std::
                function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::operator()(&this->callback_,&username,&password);
        std::__cxx11::string::~string((string *)&password);
        std::__cxx11::string::~string((string *)&username);
      }
      std::__cxx11::string::~string((string *)&decoded);
      std::__cxx11::string::~string((string *)&b64Auth);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&prefix);
    std::__cxx11::string::~string((string *)&authHeaderStr);
  }
  return bVar1;
}

Assistant:

bool BasicAuthHandler::AuthorizeInner(CivetServer*, mg_connection* conn) {
  const char* authHeader = mg_get_header(conn, "Authorization");

  if (authHeader == nullptr) {
    // No auth header was provided.
    return false;
  }
  std::string authHeaderStr = authHeader;

  // Basic auth header is expected to be of the form:
  // "Basic dXNlcm5hbWU6cGFzc3dvcmQ="

  const std::string prefix = "Basic ";
  if (authHeaderStr.compare(0, prefix.size(), prefix) != 0) {
    return false;
  }

  // Strip the "Basic " prefix leaving the base64 encoded auth string
  auto b64Auth = authHeaderStr.substr(prefix.size());

  std::string decoded;
  try {
    decoded = detail::base64_decode(b64Auth);
  } catch (...) {
    return false;
  }

  // decoded auth string is expected to be of the form:
  // "username:password"
  // colons may not appear in the username.
  auto splitPos = decoded.find(':');
  if (splitPos == std::string::npos) {
    return false;
  }

  auto username = decoded.substr(0, splitPos);
  auto password = decoded.substr(splitPos + 1);

  // TODO: bool does not permit a distinction between 401 Unauthorized
  //  and 403 Forbidden. Authentication may succeed, but the user still
  //  not be authorized to perform the request.
  return callback_(username, password);
}